

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_chrm_int(spng_ctx *ctx,spng_chrm_int *chrm_int)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  
  iVar8 = 1;
  if ((chrm_int != (spng_chrm_int *)0x0 && ctx != (spng_ctx *)0x0) &&
     (((ctx->data != (uchar *)0x0 || (iVar8 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
      (iVar8 = read_chunks(ctx,0), iVar8 == 0)))) {
    iVar9 = check_chrm_int(chrm_int);
    iVar8 = 0x22;
    if (iVar9 == 0) {
      uVar4 = chrm_int->white_point_x;
      uVar5 = chrm_int->white_point_y;
      uVar6 = chrm_int->red_x;
      uVar7 = chrm_int->red_y;
      uVar1 = chrm_int->green_y;
      uVar2 = chrm_int->blue_x;
      uVar3 = chrm_int->blue_y;
      (ctx->chrm_int).green_x = chrm_int->green_x;
      (ctx->chrm_int).green_y = uVar1;
      (ctx->chrm_int).blue_x = uVar2;
      (ctx->chrm_int).blue_y = uVar3;
      (ctx->chrm_int).white_point_x = uVar4;
      (ctx->chrm_int).white_point_y = uVar5;
      (ctx->chrm_int).red_x = uVar6;
      (ctx->chrm_int).red_y = uVar7;
      *(byte *)&ctx->stored = *(byte *)&ctx->stored | 4;
      *(byte *)&ctx->user = *(byte *)&ctx->user | 4;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int spng_set_chrm_int(spng_ctx *ctx, struct spng_chrm_int *chrm_int)
{
    SPNG_SET_CHUNK_BOILERPLATE(chrm_int);

    if(check_chrm_int(chrm_int)) return SPNG_ECHRM;

    ctx->chrm_int = *chrm_int;

    ctx->stored.chrm = 1;
    ctx->user.chrm = 1;

    return 0;
}